

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void writeOutput(FILE *outf,char *groupname,dotNode *(*results) [7],int spike,int method,
                char *extrastr,float probeRad)

{
  long lVar1;
  long *plVar2;
  double dVar3;
  atom *paVar4;
  atom *paVar5;
  residue_t *prVar6;
  residue_t *prVar7;
  long lVar8;
  int class;
  FILE *pFVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  void *__s;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  dotNode_t *pdVar17;
  int iVar18;
  char *pcVar19;
  char *pcVar20;
  FILE *__stream;
  dotNode *pdVar21;
  uint uVar22;
  long lVar23;
  bool bVar24;
  double dVar25;
  undefined4 uVar26;
  char ptm [2];
  char *local_1d8;
  undefined1 local_1d0;
  undefined1 uStack_1cf;
  char cStack_1ce;
  undefined1 uStack_1cd;
  undefined1 uStack_1cc;
  undefined1 uStack_1cb;
  undefined1 uStack_1ca;
  dotNode *(*local_1c8) [7];
  int local_1bc;
  FILE *local_1b8;
  char *local_1b0;
  char extraMstr [32];
  long local_188;
  char *mast [7];
  char strcName [6];
  char lastpointid [100];
  char pointid [100];
  
  ptm[0] = ' ';
  ptm[1] = '\0';
  mast[6] = "H-bonds";
  mast[4] = "bad overlap";
  mast[5] = "worse overlap";
  mast[2] = "weak H-bonds";
  mast[3] = "small overlap";
  mast[0] = "wide contact";
  mast[1] = "close contact";
  uStack_1cc = 0;
  uStack_1cb = 0;
  uStack_1ca = 0;
  if (probeRad <= 0.25) {
    probeRad = 0.25;
  }
  local_1d0 = 0;
  uStack_1cf = 0;
  cStack_1ce = '\0';
  uStack_1cd = 0;
  uVar10 = (uint)((probeRad + probeRad + 0.5) / 0.05 + 2.0);
  local_1c8 = (dotNode *(*) [7])(ulong)uVar10;
  lVar12 = (long)(int)uVar10;
  local_1bc = spike;
  local_1b8 = (FILE *)outf;
  __s = malloc(lVar12 * 8);
  if ((Lgapbins == '\x01') && (0 < (int)local_1c8)) {
    memset(__s,0,lVar12 * 8);
  }
  mast[0] = "vdw contact";
  mast[1] = "vdw contact";
  if (LMasterName == '\x01') {
    sprintf(extraMstr," master={%s}",extrastr);
  }
  else {
    extraMstr[0] = '\0';
  }
  __stream = local_1b8;
  fprintf(local_1b8,"@subgroup dominant {%s}\n",groupname);
  if (method == 0) {
    pcVar15 = "surface";
    mast[1] = "surface";
  }
  else {
    if (((OutputVDWs | OnlyBadOut) & 1) == 0) {
      fprintf(__stream,"@master {%s}\n","vdw contact");
    }
    if (((~OutputClashes | OnlyBadOut) & 1) != 0) {
      if ((OnlyBadOut & 1) == 0) {
        fprintf(__stream,"@master {%s}\n","small overlap");
      }
      fprintf(__stream,"@master {%s}\n","bad overlap");
      if (LworseOverlap == '\x01') {
        fprintf(__stream,"@master {%s}\n","worse overlap");
      }
    }
    if (((OutputHBs != '\0') || ((OnlyBadOut & 1) != 0)) ||
       (fprintf(__stream,"@master {%s}\n","H-bonds"), LweakHbonds != '\x01')) goto LAB_0012e8f9;
    pcVar15 = "weak H-bonds";
  }
  fprintf(__stream,"@master {%s}\n",pcVar15);
LAB_0012e8f9:
  if (0 < mcmccont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {McMc contacts}\n",0x4d);
  }
  if (0 < scsccont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {ScSc contacts}\n",0x53);
  }
  if (0 < mcsccont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {McSc contacts}\n",0x50);
  }
  if (0 < othrcont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {Hets contacts}\n",0x4f);
  }
  if (Lgapbins == '\x01') {
    lVar23 = 0;
    do {
      fprintf(__stream,"@pointmaster \'%c\' {gap %3.2f}\n",
              (double)((int)lVar23 + -0xb) / 20.0 + 0.05,
              (ulong)(uint)(int)(char)(&DAT_0013e990)[lVar23]);
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0x16);
  }
  iVar18 = (int)local_1c8;
  lVar23 = 0;
  local_188 = 0;
  local_1b0 = "";
  do {
    uVar16 = 0;
    do {
      pdVar21 = results[lVar23][uVar16];
      if (pdVar21 != (dotNode *)0x0) {
        iVar11 = (int)lVar23;
        class = (int)uVar16;
        if (uVar16 < 2) {
          if (AtomMasters != '\x01') {
            if ((LOneDotEach & 1) == 0) {
              local_1d8 = getColor(iVar11);
              pcVar13 = mast[uVar16];
              pcVar19 = "";
              if (LensDots != '\0') {
                pcVar19 = " lens";
              }
              pcVar20 = "@dotlist {x} color=%s master={%s}%s%s\n";
            }
            else {
              local_1d8 = getColor(iVar11);
              pcVar13 = mast[uVar16];
              pcVar19 = "";
              if (LensDots != '\0') {
                pcVar19 = " lens";
              }
              pcVar20 = "@balllist {x} radius=0.2 color=%s master={%s}%s%s\n";
            }
            pcVar15 = extraMstr;
            goto LAB_0012edf6;
          }
          if ((LOneDotEach & 1) == 0) {
            local_1d8 = getColor(iVar11);
            pcVar13 = getAtomName(iVar11);
            pcVar15 = mast[uVar16];
            pcVar20 = "";
            if (LensDots != '\0') {
              pcVar20 = " lens";
            }
            pcVar19 = "@dotlist {x} color=%s master={%s dots} master={%s}%s%s\n";
          }
          else {
            local_1d8 = getColor(iVar11);
            pcVar13 = getAtomName(iVar11);
            pcVar15 = mast[uVar16];
            pcVar20 = "";
            if (LensDots != '\0') {
              pcVar20 = " lens";
            }
            pcVar19 = "@balllist {x} radius=0.2 color=%s master={%s dots} master={%s}%s%s\n";
          }
          fprintf(__stream,pcVar19,local_1d8,pcVar13,pcVar15,extraMstr,pcVar20);
        }
        else {
          if (class - 3U < 3 && local_1bc != 0) {
            if (AtomMasters != '\x01') {
              if ((LOneDotEach & 1) == 0) {
                pcVar13 = getColor(iVar11);
                pcVar15 = mast[uVar16];
                pcVar20 = "@vectorlist {x} color=%s master={%s}%s\n";
              }
              else {
                pcVar13 = getColor(iVar11);
                pcVar15 = mast[uVar16];
                pcVar20 = "@vectorlist {x} width=7 color=%s master={%s}%s\n";
              }
LAB_0012ee20:
              fprintf(__stream,pcVar20,pcVar13,pcVar15,extraMstr);
              goto LAB_0012ee34;
            }
            if ((LOneDotEach & 1) == 0) {
              local_1d8 = getColor(iVar11);
              pcVar13 = getAtomName(iVar11);
              pcVar15 = mast[uVar16];
              pcVar20 = "@vectorlist {x} color=%s master={%s dots} master={%s}%s\n";
            }
            else {
              local_1d8 = getColor(iVar11);
              pcVar13 = getAtomName(iVar11);
              pcVar15 = mast[uVar16];
              pcVar20 = "@vectorlist {x} width=7 color=%s master={%s dots} master={%s}%s\n";
            }
          }
          else {
            if (uVar16 == 6) {
              if (AtomMasters != '\x01') {
                if ((LOneDotEach & 1) == 0) {
                  pcVar13 = getColor(iVar11);
                  pcVar15 = mast[6];
LAB_0012ee16:
                  pcVar20 = "@dotlist {x} color=%s master={%s}%s\n";
                }
                else {
                  pcVar13 = getColor(iVar11);
                  pcVar15 = mast[6];
LAB_0012ed99:
                  pcVar20 = "@ringlist {x} radius=0.2 color=%s master={%s}%s\n";
                }
                goto LAB_0012ee20;
              }
              if ((LOneDotEach & 1) == 0) {
                local_1d8 = getColor(iVar11);
                pcVar13 = getAtomName(iVar11);
                pcVar15 = mast[6];
LAB_0012eddf:
                pcVar20 = "@dotlist {x} color=%s master={%s dots} master={%s}%s\n";
                goto LAB_0012ede9;
              }
              local_1d8 = getColor(iVar11);
              pcVar13 = getAtomName(iVar11);
              pcVar15 = mast[6];
            }
            else {
              if (LweakHbonds != '\x01') goto LAB_0012ee34;
              if (AtomMasters != '\x01') {
                if ((LOneDotEach & 1) == 0) {
                  pcVar13 = getColor(iVar11);
                  pcVar15 = mast[uVar16];
                  goto LAB_0012ee16;
                }
                pcVar13 = getColor(iVar11);
                pcVar15 = mast[uVar16];
                goto LAB_0012ed99;
              }
              if ((LOneDotEach & 1) == 0) {
                local_1d8 = getColor(iVar11);
                pcVar13 = getAtomName(iVar11);
                pcVar15 = mast[uVar16];
                goto LAB_0012eddf;
              }
              local_1d8 = getColor(iVar11);
              pcVar13 = getAtomName(iVar11);
              pcVar15 = mast[uVar16];
            }
            pcVar20 = "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n";
          }
LAB_0012ede9:
          pcVar19 = extraMstr;
LAB_0012edf6:
          fprintf(__stream,pcVar20,local_1d8,pcVar13,pcVar15,pcVar19);
        }
LAB_0012ee34:
        bVar24 = local_1bc != 0;
        lastpointid[0] = '\0';
        do {
          pFVar9 = local_1b8;
          paVar4 = pdVar21->a;
          paVar5 = pdVar21->t;
          if (Lgapbins == '\x01') {
            local_1d0 = 0x20;
            uStack_1cf = 0x27;
            uStack_1cd = 0x20;
            uStack_1cc = 0x27;
            uStack_1cb = 0x20;
            uStack_1ca = 0;
            cStack_1ce = pdVar21->ptmaster;
          }
          else if (pdVar21->ptmaster == ' ') {
            local_1d0 = 0;
          }
          else {
            local_1d0 = 0x20;
            uStack_1cf = 0x27;
            uStack_1cd = 0x27;
            uStack_1cc = 0x20;
            uStack_1cb = 0;
            cStack_1ce = pdVar21->ptmaster;
          }
          prVar6 = paVar4->r;
          if (LOneDotEach == 1) {
            prVar7 = paVar5->r;
            sprintf(pointid,"%s%c%s%s%c%s %s%c%s%s%c%s GAP %6.3f",(double)pdVar21->gap,
                    paVar4->atomname,(ulong)(uint)(int)paVar4->altConf,prVar6->resname,
                    prVar6->Hy36resno,(ulong)(uint)(int)prVar6->resInsCode,prVar6->chain,
                    paVar5->atomname,(ulong)(uint)(int)paVar5->altConf,prVar7->resname,
                    prVar7->Hy36resno,(ulong)(uint)(int)prVar7->resInsCode,prVar7->chain);
            __stream = pFVar9;
          }
          else {
            sprintf(pointid,"%s%c%s%s%c%s",paVar4->atomname,(ulong)(uint)(int)paVar4->altConf,
                    prVar6->resname,prVar6->Hy36resno,(ulong)(uint)(int)prVar6->resInsCode,
                    prVar6->chain);
          }
          iVar11 = strcmp(pointid,lastpointid);
          if (iVar11 == 0) {
            fwrite("{\"}",3,1,__stream);
          }
          else {
            strcpy(lastpointid,pointid);
            fprintf(__stream,"{%s}",pointid);
          }
          if (ColorGap == '\0') {
            if (pdVar21->t == (atom *)0x0) {
              fprintf(__stream,"%s ",OutPointColor);
            }
            else {
              local_1b0 = assignGapColorForKin(pdVar21->gap,class);
              fputs(local_1b0,__stream);
            }
          }
          if (Lgapbins == '\x01') {
            if (0 < (int)local_1c8) {
              lVar14 = 0;
              do {
                if (pdVar21->gap < ((float)(int)(uint)lVar14 + -11.0) / 20.0 + 0.05) {
                  uStack_1cd = (&DAT_0013e990)[lVar14];
                  lVar8 = *(long *)((long)__s + lVar14 * 8);
                  lVar1 = lVar8 + 1;
                  *(long *)((long)__s + lVar14 * 8) = lVar1;
                  if (local_188 <= lVar8) {
                    local_188 = lVar1;
                  }
                  if ((uint)lVar14 < 0x16) goto LAB_0012f0b3;
                  break;
                }
                lVar14 = lVar14 + 1;
              } while (iVar18 != (int)lVar14);
            }
            uStack_1cd = 0x5a;
            plVar2 = (long *)((long)__s + lVar12 * 8 + -8);
            *plVar2 = *plVar2 + 1;
          }
LAB_0012f0b3:
          dVar25 = (pdVar21->loc).x;
          uVar26 = SUB84((pdVar21->loc).y,0);
          dVar3 = (pdVar21->loc).z;
          if (class - 3U < 3 && bVar24) {
            fprintf(__stream,"P %s%.3f,%.3f,%.3f {\"}%s %s%.3f,%.3f,%.3f\n",dVar25,uVar26,dVar3,
                    (pdVar21->spike).x,(pdVar21->spike).y,(pdVar21->spike).z,&local_1d0,local_1b0,
                    &local_1d0);
          }
          else {
            fprintf(__stream,"%s%.3f,%.3f,%.3f\n",dVar25,uVar26,dVar3,&local_1d0);
          }
          pdVar21 = pdVar21->next;
        } while (pdVar21 != (dotNode_t *)0x0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 7);
    lVar23 = lVar23 + 1;
    if (lVar23 == 0x72) {
      if (Lgapbins == '\x01') {
        fwrite("@text\n",6,1,__stream);
        if (0 < (int)local_1c8) {
          lVar23 = 0;
          do {
            fprintf(__stream,"{%5.2f, %8.0ld }\n",((double)(int)lVar23 + -11.0) / 20.0 + 0.05,
                    *(undefined8 *)((long)__s + lVar23 * 8));
            lVar23 = lVar23 + 1;
          } while (lVar12 != lVar23);
        }
        fwrite("@kinemage 2\n",0xc,1,__stream);
        fwrite("@group {gapbins} dominant\n",0x1a,1,__stream);
        fwrite("@vectorlist {gapbins}\n",0x16,1,__stream);
        uVar10 = (int)local_1c8 - 1;
        if (1 < (int)local_1c8) {
          uVar16 = 0;
          do {
            dVar25 = ((double)(int)uVar16 + -11.0) / 20.0 + 0.05;
            fprintf(__stream,"{%5.2f, %8.0ld } %5.2f, %8f, 0.00\n",dVar25,
                    SUB84(dVar25 * (double)local_188,0),(double)*(long *)((long)__s + uVar16 * 8));
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
        }
        fwrite("@labellist {gapbins}\n",0x15,1,__stream);
        fwrite("{0} 0.0, -1.0, 0.0\n",0x13,1,__stream);
        if (LXHvector == '\x01') {
          fwrite("@kinemage 3\n",0xc,1,__stream);
          fwrite("@pointmaster \'A\' {B<=10}\n",0x19,1,__stream);
          fwrite("@pointmaster \'B\' {B<=15}\n",0x19,1,__stream);
          fwrite("@pointmaster \'C\' {B<=20}\n",0x19,1,__stream);
          fwrite("@pointmaster \'D\' {B<=25}\n",0x19,1,__stream);
          fwrite("@pointmaster \'E\' {B<=30}\n",0x19,1,__stream);
          fwrite("@pointmaster \'F\' {B<=40}\n",0x19,1,__stream);
          fwrite("@pointmaster \'G\' {B<=50}\n",0x19,1,__stream);
          fwrite("@pointmaster \'H\' {B >50}\n",0x19,1,__stream);
          fwrite("@group {AXES} dominant\n",0x17,1,__stream);
          fwrite("@labellist {gapbins}\n",0x15,1,__stream);
          if (1 < (int)local_1c8) {
            uVar22 = 0;
            do {
              dVar25 = ((double)(int)uVar22 + -11.0) / 20.0 + 0.05;
              fprintf(__stream,"{%5.2f} %5.2f, 0.00, 0.00\n",dVar25,SUB84(dVar25 * 100.0,0));
              uVar22 = uVar22 + 1;
            } while (uVar10 != uVar22);
          }
          dVar25 = 90.0;
          uVar10 = 0x50;
          do {
            fprintf(__stream,"{%5.2f} -70.0, %5.2f, 0.00\n",dVar25,
                    SUB84((double)(int)(uVar10 - 0x50),0));
            dVar25 = dVar25 + 10.0;
            uVar10 = uVar10 + 10;
          } while (uVar10 < 0xab);
          strcName[4] = inputfilename[4];
          strcName[5] = inputfilename[5];
          strcName[0] = inputfilename[0];
          strcName[1] = inputfilename[1];
          strcName[2] = inputfilename[2];
          strcName[3] = inputfilename[3];
          lVar12 = 0;
          fprintf(__stream,"@group {%8s} dominant animate\n");
          fwrite("@dotlist {gapangle}\n",0x14,1,__stream);
          do {
            local_1c8 = results + lVar12;
            local_1b0 = (char *)0x0;
            do {
              pdVar17 = (*local_1c8)[(long)local_1b0];
              if (pdVar17 != (dotNode *)0x0) {
                do {
                  paVar4 = pdVar17->a;
                  paVar5 = pdVar17->t;
                  iVar18 = 0;
                  uVar10 = 0;
                  do {
                    if (paVar4->bval < (float)iVar18) {
                      if (uVar10 < 3) {
                        ptm[0] = 'A';
                        goto LAB_0012f5a6;
                      }
                      if (uVar10 == 3) {
                        ptm[0] = 'B';
                        goto LAB_0012f5a6;
                      }
                      if (uVar10 < 5) {
                        ptm[0] = 'C';
                        goto LAB_0012f5a6;
                      }
                      if (uVar10 == 5) {
                        ptm[0] = 'D';
                        goto LAB_0012f5a6;
                      }
                      if (uVar10 < 7) {
                        ptm[0] = 'E';
                        goto LAB_0012f5a6;
                      }
                      if (uVar10 != 9) {
                        if (uVar10 == 7) {
                          ptm[0] = 'F';
                        }
                        else {
                          ptm[0] = 'G';
                        }
                        goto LAB_0012f5a6;
                      }
                      break;
                    }
                    uVar10 = uVar10 + 1;
                    iVar18 = iVar18 + 5;
                  } while (uVar10 != 10);
                  ptm[0] = 'H';
LAB_0012f5a6:
                  prVar6 = paVar4->r;
                  uVar26 = SUB84((double)paVar4->bval,0);
                  prVar7 = paVar5->r;
                  fprintf(local_1b8,
                          "{%6s %s%c%s%s%c%s:O=%4.2f, B=%6.2f; %s%c%s%s%c%s:O=%4.2f, B=%6.2f; GAP %6.3f}\'%s\' %8.3f, %8.3f , %8.3f\n"
                          ,(double)paVar4->occ,uVar26,(double)paVar5->occ,(double)paVar5->bval,
                          (double)pdVar17->gap,(double)(pdVar17->gap * 100.0),
                          (double)pdVar17->angle + -90.0,uVar26,strcName,paVar4->atomname,
                          (ulong)(uint)(int)paVar4->altConf,prVar6->resname,prVar6->Hy36resno,
                          (ulong)(uint)(int)prVar6->resInsCode,prVar6->chain,paVar5->atomname,
                          (ulong)(uint)(int)paVar5->altConf,prVar7->resname,prVar7->Hy36resno,
                          (ulong)(uint)(int)prVar7->resInsCode,prVar7->chain,ptm);
                  pdVar17 = pdVar17->next;
                } while (pdVar17 != (dotNode_t *)0x0);
                fputc(10,local_1b8);
              }
              local_1b0 = (char *)((long)local_1b0 + 1);
            } while (local_1b0 != (char *)0x7);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x72);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void writeOutput(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH], int spike, int method, char* extrastr, float probeRad)
{ /*writeOutput for kinemage*/
   /*add probeRad 20111220dcr*/
   /*dcr041020 need method for better kinemage keywords*/
   /* 060129 extrastr for extra master to control orig vs fitted dots */
   int i, j;
   int k; /*counter for gapbins 111020dcr*/
   char ptm[2] = {' ','\0'}; /*20120120dcr ptmaster for bval*/
   dotNode *node;
   atom *a; /*owner of dot*/
   atom *t; /*cause of dot, output for OneDotEach mode 110113*/
   char *color = "";
  // OLD: char *mast[NODEWIDTH] = {"wide  contact", "close contact", "small overlap",
                           // "bad overlap", "H-bonds", "H-weaks"};
                            /*111215dcr weakHbonds option*/
   char *mast[NODEWIDTH] = {"wide contact", "close contact", "weak H-bonds", "small overlap", "bad overlap",
                            "worse overlap", "H-bonds"}; /* 04/13/2015 SJ changed to match new NODEWIDTH, see probe.h*/
   char *surfacestr = "surface"; /*041020*/
   char *contactstr = "vdw contact"; /*060129*/
   char extraMstr[32]; /*fill below with extra master name 060129*/
   char pointid[100], lastpointid[100];
   char ptmast[7]={'\0','\0','\0','\0','\0','\0','\0'}; /*111020dcr 6 to 7 */
   /*dcr041009 string to hold 'M' (McMc), 'S' (ScSc), 'P' (McSc), 'O' (other)*/
   /*dcr041009 ptmaster part of each dotNode member of results[][]*/
   char masterchr=' '; /*dcr041017*/
/*111020dcr gapbin ptmasters*/
   int ngapbins = 22; /*(std probe diameter .5 +clash overlap .5=1.0/0.05interval) +2*/
   /*+1 for 0th fence post, another +1 for X excess*/
   char gapnamestr[22] =
{'z','y','x','w','v','u','t','g','r','q','f','F','Q','R','G','T','U','V','W','X','Y','Z'};
/*0 , 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 ,10 ,11 ,12 ,13 ,14 ,15 ,16 ,17 ,18 ,19 ,20 ,21*/
   /*std gapbins scope at least -.5 to +.5, wider if probeRad > 0.25 standard*/
   int  gaplimit = ((2*(probeRad>0.25f?probeRad:0.25f) +0.5f)/0.05f)+2;  /*20111220dcr*/
   long *gapcounts = (long *) malloc(gaplimit * sizeof(long));
   long maxgapcounts = 0;
   int  Lgotgapbin = FALSE;
   char strcName[6]; /*first nendstr char of inputfilename 20120120dcr*/
   int  nendstr = 6;

   if(Lgapbins) /*111020dcr gapbins pointmasters, 111215dcr count bin entries*/
   {
      for(k=0; k<gaplimit;k++)
      {
         gapcounts[k] = 0;
      }
   }

   if(LMergeContacts)  /*060129*/
   {
      mast[0] = contactstr;
      mast[1] = contactstr;
   }
   if(LMasterName)  /*060129*/
   {
      sprintf(extraMstr," master={%s}",extrastr);
   }
   else{extraMstr[0] = '\0';} /*occupies no space in output*/

   fprintf(outf, "@subgroup dominant {%s}\n", groupname);
   /*list masters for contact types dcr041020*/
   if(method == EXTERNALSURFACE) /*dcr041020*/
   {/*a bit crude, but better than calling all surfaces a close contact*/
      mast[1] = surfacestr; /*the only master button invoked dcr041020*/
      fprintf(outf, "@master {%s}\n", mast[1]); /*was close contact*/
   }
   else
   {/*fine control over masters names   dcr041020*/
      if (OutputVDWs && !OnlyBadOut) { /*dcr041010*/
         fprintf(outf, "@master {%s}\n", mast[0]);
        if(!LMergeContacts)
         fprintf(outf, "@master {%s}\n", mast[1]);
      }
      if (OutputClashes || OnlyBadOut) { /*dcr041010*/
         if(!OnlyBadOut) {
             //fprintf(outf, "@master {%s}\n", mast[2]);
             fprintf(outf, "@master {%s}\n", mast[3]); /* 04/13/2015 SJ changed to match new number for small overlaps*/
         }
         //fprintf(outf, "@master {%s}\n", mast[3]); /*the Bad clashes*/
         fprintf(outf, "@master {%s}\n", mast[4]); /* 04/13/2015 SJ changed to match new number for bad overlaps*/
          if (LworseOverlap) {/* 04/13/2015 SJ if the worse overlaps are separated*/
              fprintf(outf, "@master {%s}\n", mast[5]);
          }
      }
      if (OutputHBs && !OnlyBadOut)
      { /*dcr041010*/
         //fprintf(outf, "@master {%s}\n", mast[4]);/* 04/13/2015 SJ changed to match new number for H bonds*/
         fprintf(outf, "@master {%s}\n", mast[6]);
         if(LweakHbonds) /*111215dcr*/
         {
            //fprintf(outf, "@master {%s}\n", mast[5]);
             fprintf(outf, "@master {%s}\n", mast[2]);/* 04/13/2015 SJ changed to match new number for weak H bonds*/
         }
      }
   }/*fine control over masters names*/ /* 04/15/2015 SJ changing all 5s to 7s to reflect new initialization*/
   //if(mcmccont[0][5] > 0)
   if(mcmccont[0][7] > 0)
   {
      masterchr = MCMCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {McMc contacts}\n",masterchr);
   }
   //if(scsccont[0][5] > 0)
   if(scsccont[0][7] > 0)
   {
      masterchr = SCSCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {ScSc contacts}\n",masterchr);
   }
   //if(mcsccont[0][5] > 0)
   if(mcsccont[0][7] > 0)
   {
      masterchr = MCSCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {McSc contacts}\n",masterchr);
   }
   //if(othrcont[0][5] > 0)
   if(othrcont[0][7] > 0)
   {
      masterchr = OTHERCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {Hets contacts}\n",masterchr);
   }
   if(Lgapbins) /*111020dcr*/
   {
      for(i = 0; i < ngapbins; i++)
      {
        fprintf(outf, "@pointmaster '%c' {gap %3.2f}\n"
                ,gapnamestr[i],(((float)i-11.0)/20.0)+0.05); /*20111220dcr +0.05*/
      }
   }
   for (i = 0; i < NUMATOMTYPES; i++)
   {/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
      for (j = 0; j < NODEWIDTH; j++)
      {/* OLD j: wide contact, close contact, small overlap, bad overlap, H-bonds*/
              /*OLD optionally: H-weaks if LweakHbonds  111215dcr*/
          /* NEW 04/13/2015 - SJ j: wide contact, close contact, weak H bonds, small overlap, bad overlap, worse overlap, H-bonds*/
         node = results[i][j]; /*head of list of dot nodes, i.e. first node*/
         if (node)
         {/*node exists, write list headers*/
           if (j == 0 || j == 1) /*wide and close contacts*/
           {/* contact */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@balllist {x} radius=0.2 color=%s master={%s dots} master={%s}%s%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr,
                  LensDots ? " lens" : "");
                }
                else
                {
                   fprintf(outf,
                   "@dotlist {x} color=%s master={%s dots} master={%s}%s%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr,
                   LensDots ? " lens" : "");
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                     "@balllist {x} radius=0.2 color=%s master={%s}%s%s\n",
                   getColor(i), mast[j],extraMstr,
                   LensDots ? " lens" : "");
                }
                else
                {
                    fprintf(outf,
                      "@dotlist {x} color=%s master={%s}%s%s\n",
                    getColor(i), mast[j],extraMstr,
                    LensDots ? " lens" : "");
                }
             }
           }/* contact */
          // else if ((j == 2 || j == 3) && spike)
           else if ((j == 3 || j == 4 || j == 5) && spike) /* 04/13/2015 SJ changed to reflect new numbers for different categories*/
           {/* bump w/ spike */
			  if (AtomMasters) 
              {
                 if(LOneDotEach)
                 {
					  fprintf(outf,
					  "@vectorlist {x} width=7 color=%s master={%s dots} master={%s}%s\n", 
					 getColor(i), getAtomName(i), mast[j],extraMstr); 
			     }
                 else
                 {
					 fprintf(outf,
					 "@vectorlist {x} color=%s master={%s dots} master={%s}%s\n",
					 getColor(i), getAtomName(i), mast[j],extraMstr); 
			     }
              }
              else
              {
                 if(LOneDotEach)
                 {
					fprintf(outf,
					 "@vectorlist {x} width=7 color=%s master={%s}%s\n",
					 getColor(i), mast[j],extraMstr); 
	             }
                 else
                 {
					 fprintf(outf,
					 "@vectorlist {x} color=%s master={%s}%s\n",
					 getColor(i), mast[j],extraMstr); 
			     }
              }
           }/* bump w/ spike */
           //else if (j == 4)
           else if (j == 6)/* 04/13/2015 SJ changed to reflect new numbers for different categories*/
           {/* bump w/o spike or H-bond */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                    "@dotlist {x} color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                  "@dotlist {x} color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
             }
           }/* bump w/o spike or H-bond */
           else if (LweakHbonds)
           {/* H-weak */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                    "@dotlist {x} color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                  "@dotlist {x} color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
             }
           }/* H-weak */

           lastpointid[0] = '\0'; /* reset */
         }/*node exists, write list headers*/
	 while(node)
         {/*kinemage point or point-line for each node in (ij)th dot-node list*/
            a = node->a; /*owner of dot*/
            t = node->t; /*cause of dot, use for OneDotEach 111013dcr*/
            if(Lgapbins) /*111020dcr*/
            {/*two characters for two pointmasters*/
               ptmast[0] = ' '; /*insure leading space*/
               ptmast[1] = '\''; /*surround char pointmasters with*/
               ptmast[2] = node->ptmaster;
               ptmast[3] = ' '; /*space for later gapbin character 111020dcr*/
               ptmast[4] = '\''; /*single quote marks*/
               ptmast[5] = ' '; /*need trailing space*/
               ptmast[6] = '\0'; /*end string*/
            }
            else if(node->ptmaster == ' ') /*dcr041009*/
            {/*blank means NO pointmaster*/
               ptmast[0] = '\0'; /*which will print as a zero-length str*/
            }
            else
            {
               ptmast[0] = ' '; /*insure leading space*/
               ptmast[1] = '\''; /*surround single char pointmaster with*/
               ptmast[2] = node->ptmaster;
               ptmast[3] = '\''; /*single quote marks*/
               ptmast[4] = ' '; /*need trailing space*/
               ptmast[5] = '\0'; /*end string*/
            }
/*     sprintf(pointid, "%s%c %s%d%c", */
/*       a->atomname, a->altConf, */
/*       a->r->resname, a->r->resid, */
/*       a->r->resInsCode); */
            if(LOneDotEach) /*report cause of dot after owner of dot 111013dcr*/
            {
               sprintf(pointid, "%s%c%s%s%c%s %s%c%s%s%c%s GAP %6.3f",
                  a->atomname, a->altConf,
                  a->r->resname, a->r->Hy36resno,
                  a->r->resInsCode, a->r->chain,
                  t->atomname, t->altConf,
                  t->r->resname, t->r->Hy36resno,
                  t->r->resInsCode, t->r->chain, node->gap);
            }
            else
            {/*usual just report owner of dot*/
               sprintf(pointid, "%s%c%s%s%c%s",
               a->atomname, a->altConf,
               a->r->resname, a->r->Hy36resno,
               a->r->resInsCode, a->r->chain);
            }

            if (strcmp(pointid, lastpointid))
            {
               strcpy(lastpointid, pointid);
               fprintf(outf, "{%s}", pointid);
            }
            else
            {
               fprintf(outf, "{\"}");
            }
            if (ColorGap)
            {
               if (node->t)
               {
                  color = assignGapColorForKin(node->gap, j);
                  fprintf(outf, "%s", color);
               }
               else
               {
                  fprintf(outf, "%s ", OutPointColor);
               }
               /* added "%s" string format to color and */
               /* edited "%s " to "%s" in OutPointColor, wba 110909 */
               /* edited "%s" back to "%s " in OutPointColor, gjk 1200907 */
            }
            if(Lgapbins) /*111020dcr gapbins pointmasters*/
            {
               Lgotgapbin = FALSE; /*until identify which gapbin*/
               for(k=0; k<gaplimit ;k++) /*20111220dcr ngapbins, just std range*/
               {
                  if(node->gap < (((float)k-11.0)/20.0)+0.05 )
                  {/*pt master intervals of 0.05 from -0.5 to +0.5*/
                     ptmast[3] = gapnamestr[k];
                     gapcounts[k] = gapcounts[k] +1;
                     if(gapcounts[k] > maxgapcounts){maxgapcounts = gapcounts[k];}
                     if(k < ngapbins)
                     {
                        Lgotgapbin = TRUE; /*got the gapbin idenity for this dot*/
                     }
                     break; /*out of for loop*/
                  }
               }
               if(!Lgotgapbin)
               {/*assign this node, aka dot, to overflow gapbin*/
                  ptmast[3] = gapnamestr[ngapbins-1]; /*the overflow bin-master*/
                  gapcounts[gaplimit-1] = gapcounts[gaplimit-1] +1; /*last gapbin*/
                  /*if(gapcounts[gaplimit-1] > maxgapcounts)
                          {maxgapcounts = gapcounts[gaplimit-1];}*/
               }
            }
            //if ((j == 2 || j == 3) && spike)
            if ((j == 3 || j == 4 || j == 5) && spike)/* 04/13/2015 SJ changed to reflect new numbers for different categories*/
            {/* bump */
              fprintf(outf,
                     "P %s%.3f,%.3f,%.3f {\"}%s %s%.3f,%.3f,%.3f\n", /*dcr041009*/
                      ptmast,node->loc.x, node->loc.y, node->loc.z, /*dcr041009*/
                      color,      /*** note: second color reference */
                      ptmast,node->spike.x, node->spike.y, node->spike.z); /*dcr041009*/
            }
            else
            {/* contact or H-bond */
              fprintf(outf, "%s%.3f,%.3f,%.3f\n", /*dcr041009*/
                      ptmast,node->loc.x, node->loc.y, node->loc.z); /*dcr041009*/
            }
            node = node->next; /*in this (ij)th dot-node list*/
         }/*kinemage point or point-line for each node in (ij)th dot-node list*/
      }/*OLD j: wide contact, close contact, small overlap, bad overlap, H-bonds*/ /* see new def in NODEWIDTH probe.h*/
   }/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
   if(Lgapbins) /*111020dcr gapbins pointmasters, 111215dcr count bin entries*/
   {/*Lgapbins TRUE*/
      fprintf(outf, "@text\n");
      for(k=0; k<gaplimit;k++) /*20111220dcr gaplimit*/
      {
          fprintf(outf, "{%5.2f, %8.0ld }\n",
             ((((float)k-11.0)/20.0)+0.05),gapcounts[k]);
      }

/*kinemage 2*/
      fprintf(outf, "@kinemage 2\n");
      fprintf(outf, "@group {gapbins} dominant\n");
      fprintf(outf, "@vectorlist {gapbins}\n");
      for(k=0; k<(gaplimit-1);k++) /*not plot sum of all over-wide dots*/
      {
          fprintf(outf, "{%5.2f, %8.0ld } %5.2f, %8f, 0.00\n",
             ((((float)k-11.0)/20.0)+0.05),gapcounts[k],
             ((((float)k-11.0)/20.0)+0.05)*(float)maxgapcounts,(float)gapcounts[k]);
      }
      fprintf(outf, "@labellist {gapbins}\n");
      fprintf(outf, "{0} 0.0, -1.0, 0.0\n");

/*kinemage 3*/
     if(LXHvector)
     {
      /*write list headers*/
      fprintf(outf, "@kinemage 3\n");
      /*for(k=1; k<10; k++){fprintf(outf, "@pointmaster '%d' {B<=%d}\n",k,10*k);}*/
      fprintf(outf, "@pointmaster 'A' {B<=10}\n");
      fprintf(outf, "@pointmaster 'B' {B<=15}\n");
      fprintf(outf, "@pointmaster 'C' {B<=20}\n");
      fprintf(outf, "@pointmaster 'D' {B<=25}\n");
      fprintf(outf, "@pointmaster 'E' {B<=30}\n");
      fprintf(outf, "@pointmaster 'F' {B<=40}\n");
      fprintf(outf, "@pointmaster 'G' {B<=50}\n");
      fprintf(outf, "@pointmaster 'H' {B >50}\n");

      fprintf(outf, "@group {AXES} dominant\n");
      fprintf(outf, "@labellist {gapbins}\n");
      for(k=0; k<(gaplimit-1);k++)
      {
          fprintf(outf, "{%5.2f} %5.2f, 0.00, 0.00\n",
             ((((float)k-11.0)/20.0)+0.05), 100*(((((float)k-11.0)/20.0)+0.05)) );
      }
      for(k=90; k<=180; k=k+10)
      {
         fprintf(outf, "{%5.2f} -70.0, %5.2f, 0.00\n",(float)k,(float)(k-90));
      }
      if(sizeof(inputfilename) < nendstr) {nendstr = sizeof(inputfilename);}
      for(k=0; k<nendstr; k++) {strcName[k]=inputfilename[k];}

      /*Note first nemdstr char of inputfilename 20120120dcr*/
      fprintf(outf, "@group {%8s} dominant animate\n",strcName);
      fprintf(outf, "@dotlist {gapangle}\n");

      for (i = 0; i < NUMATOMTYPES; i++)
      {/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
       for (j = 0; j < NODEWIDTH; j++)
       {/*Old: j: wide contact, close contact, small overlap, bad overlap, H-bonds*/ /* see NODEWIDTH in probe.h for new def. SJ 04/16/2015*/
              /*optionally: H-weaks if LweakHbonds  111215dcr*/
        node = results[i][j]; /*head of list of dot nodes, i.e. first node*/
        if (node)
        {/*node exists*/

         while(node)
         {/*kinemage point or point-line for each node in (ij)th dot-node list*/
           a = node->a; /*owner of dot*/
           t = node->t; /*cause of dot, use for OneDotEach 111013dcr*/
           /* Slow way to determine integer truncation of k/5 with a maximum of 9. */
           for(k=0; k<10; k++){if(a->bval < k*5) {break;}}
           /*2:10A,3:15B,4:20C,5:25D,6:30E,8:40F,10:50G*/
           if(k<=2){ptm[0] = 'A';}
           else if(k<=3){ptm[0] = 'B';}
           else if(k<=4){ptm[0] = 'C';}
           else if(k<=5){ptm[0] = 'D';}
           else if(k<=6){ptm[0] = 'E';}
           else if(k<=7){ptm[0] = 'F';}
           else if(k<=8){ptm[0] = 'G';}
           else{ptm[0] = 'H';}
           /*Note first nemdstr char of inputfilename 20120120dcr*/
           fprintf(outf,"{%6s %s%c%s%s%c%s:O=%4.2f, B=%6.2f; %s%c%s%s%c%s:O=%4.2f, B=%6.2f; GAP %6.3f}'%s' %8.3f, %8.3f , %8.3f\n",
                  strcName,
                  a->atomname, a->altConf,
                  a->r->resname, a->r->Hy36resno,
                  a->r->resInsCode, a->r->chain, a->occ, a->bval,
                  t->atomname, t->altConf,
                  t->r->resname, t->r->Hy36resno,
                  t->r->resInsCode, t->r->chain, t->occ, t->bval, node->gap, ptm,
                  100*(node->gap), (node->angle)-90.0, a->bval);

           node = node->next; /*in this (ij)th dot-node list*/
         }/*kinemage point or point-line for each node in (ij)th dot-node list*/
         fprintf(outf, "\n");
        }/*node exists*/
       }/*NODEWIDTH*/
      }/*NUMATOMTYPES*/
     }/*LXHvector*/
  }/*Lgapbins TRUE*/

}